

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
immutable::vector_iterator<int,_false,_6>::vector_iterator
          (vector_iterator<int,_false,_6> *this,ref<immutable::rrb<int,_false,_6>_> *impl)

{
  rrb<int,_false,_6> *prVar1;
  uint local_30 [2];
  void *local_28;
  ref<immutable::rrb<int,_false,_6>_> *local_20;
  ref<immutable::rrb<int,_false,_6>_> *impl_local;
  vector_iterator<int,_false,_6> *this_local;
  
  local_20 = impl;
  impl_local = &this->_impl;
  ref<immutable::rrb<int,_false,_6>_>::ref(&this->_impl,impl);
  prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->(local_20);
  this->_index = prVar1->cnt;
  local_28 = (void *)0x0;
  local_30[1] = 0xffffffff;
  local_30[0] = 0xffffffff;
  std::tuple<const_int_*,_unsigned_int,_unsigned_int>::
  tuple<std::nullptr_t,_unsigned_int,_unsigned_int,_true,_true>
            (&this->_cursor,&local_28,local_30 + 1,local_30);
  return;
}

Assistant:

vector_iterator(const ref<rrb<T, atomic_ref_counting, N>>& impl, end_type) : _impl(impl), _index(impl->cnt), _cursor{ nullptr, (size_type)-1, (size_type)-1 } {}